

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

bool __thiscall PowerPos<0,_0,_0>::propagate_case_one(PowerPos<0,_0,_0> *this)

{
  IntVar *pIVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  
  pIVar1 = (this->x).var;
  if (((pIVar1->min).v == 1) && ((pIVar1->max).v == 1)) {
    if (1 < (((this->z).var)->max).v) {
      if (so.lazy) {
        iVar2 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[8])();
        uVar3 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
        uVar4 = (ulong)uVar3 << 0x20 | (long)iVar2 << 2 | 3;
      }
      else {
        uVar4 = 0;
      }
      pIVar1 = (this->z).var;
      iVar2 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xf])(pIVar1,1,uVar4,1);
      if ((char)iVar2 == '\0') {
        return false;
      }
    }
    if ((((this->z).var)->min).v < 1) {
      if (so.lazy == true) {
        iVar2 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
        uVar3 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
        uVar4 = (ulong)uVar3 << 0x20 | (long)iVar2 << 2 | 3;
      }
      else {
        uVar4 = 0;
      }
      pIVar1 = (this->z).var;
      iVar2 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xe])(pIVar1,1,uVar4,1);
      if ((char)iVar2 == '\0') {
        return false;
      }
    }
  }
  pIVar1 = (this->z).var;
  if ((pIVar1->min).v != 1) {
    return true;
  }
  if ((pIVar1->max).v != 1) {
    return true;
  }
  if (1 < (((this->x).var)->max).v) {
    if (so.lazy == true) {
      iVar2 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[8])();
      uVar3 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar4 = (ulong)uVar3 << 0x20 | (long)iVar2 << 2 | 3;
    }
    else {
      uVar4 = 0;
    }
    pIVar1 = (this->x).var;
    iVar2 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xf])(pIVar1,1,uVar4,1);
    if ((char)iVar2 == '\0') {
      return false;
    }
  }
  if (0 < (((this->x).var)->min).v) {
    return true;
  }
  if (so.lazy == true) {
    iVar2 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[8])();
    uVar3 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[9])();
    uVar4 = (ulong)uVar3 << 0x20 | (long)iVar2 << 2 | 3;
  }
  else {
    uVar4 = 0;
  }
  pIVar1 = (this->x).var;
  iVar2 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xe])(pIVar1,1,uVar4,1);
  if ((char)iVar2 == '\0') {
    return false;
  }
  return true;
}

Assistant:

bool propagate_case_one() {
		// x -> z
		if (x.getMin() == 1 && x.getMax() == 1) {
			setDom(z, setMax, 1, x.getMinLit(), x.getMaxLit());
			setDom(z, setMin, 1, x.getMinLit(), x.getMaxLit());
		}
		// z -> x
		if (z.getMin() == 1 && z.getMax() == 1) {
			setDom(x, setMax, 1, z.getMinLit(), z.getMaxLit());
			setDom(x, setMin, 1, z.getMinLit(), z.getMaxLit());
		}
		return true;
	}